

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

size_t __thiscall nuraft::raft_server::get_not_responding_peers(raft_server *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint64_t uVar3;
  int iVar4;
  __node_base *p_Var5;
  size_t sVar6;
  ptr<peer> p;
  ptr<raft_params> params;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_40;
  
  nuraft::context::get_params((context *)&stack0xffffffffffffffc0);
  iVar4 = _DAT_005da970 * *(int *)&local_40[1]._vptr_state_mgr;
  p_Var5 = &(this->peers_)._M_h._M_before_begin;
  sVar6 = 0;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,(__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)(p_Var5 + 2));
    bVar2 = is_regular_member(this,(ptr<peer> *)&local_50);
    if (bVar2) {
      uVar3 = timer_helper::get_us(&(local_50._M_ptr)->last_resp_timer_);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      sVar6 = sVar6 + (iVar4 < SUB164(auVar1 / ZEXT816(1000),0));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  return sVar6;
}

Assistant:

size_t raft_server::get_not_responding_peers() {
    // Check if quorum nodes are not responding
    // (i.e., don't respond 20x heartbeat time long).
    size_t num_not_resp_nodes = 0;

    ptr<raft_params> params = ctx_->get_params();
    int expiry = params->heart_beat_interval_ *
                     raft_server::raft_limits_.response_limit_;

    // Check the number of not responding peers.
    for (auto& entry: peers_) {
        ptr<peer> p = entry.second;

        if (!is_regular_member(p)) continue;

        int32 resp_elapsed_ms = (int32)(p->get_resp_timer_us() / 1000);
        if ( resp_elapsed_ms > expiry ) {
            num_not_resp_nodes++;
        }
    }
    return num_not_resp_nodes;
}